

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O0

void Fxu_HeapSinglePrint(FILE *pFile,Fxu_HeapSingle *p)

{
  bool bVar1;
  uint local_28;
  uint local_24;
  int Degree;
  int Counter;
  Fxu_Single *pSingle;
  Fxu_HeapSingle *p_local;
  FILE *pFile_local;
  
  local_24 = 1;
  local_28 = 1;
  Fxu_HeapSingleCheck(p);
  fprintf((FILE *)pFile,"The contents of the heap:\n");
  fprintf((FILE *)pFile,"Level %d:  ",1);
  p->i = 1;
  while( true ) {
    bVar1 = false;
    if (p->i <= p->nItems) {
      bVar1 = p->pTree[p->i] != (Fxu_Single *)0x0;
    }
    if (!bVar1) break;
    if (local_24 != p->pTree[(int)local_24]->HNum) {
      __assert_fail("Counter == p->pTree[Counter]->HNum",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxu/fxuHeapS.c"
                    ,0x83,"void Fxu_HeapSinglePrint(FILE *, Fxu_HeapSingle *)");
    }
    fprintf((FILE *)pFile,"%2d=%3d  ",(ulong)local_24,(ulong)(uint)p->pTree[(int)local_24]->Weight);
    local_24 = local_24 + 1;
    if (local_24 == 1 << ((byte)local_28 & 0x1f)) {
      fprintf((FILE *)pFile,"\n");
      local_28 = local_28 + 1;
      fprintf((FILE *)pFile,"Level %d:  ",(ulong)local_28);
    }
    p->i = p->i + 1;
  }
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,"End of the heap printout.\n");
  return;
}

Assistant:

void Fxu_HeapSinglePrint( FILE * pFile, Fxu_HeapSingle * p )
{
    Fxu_Single * pSingle;
    int Counter = 1;
    int Degree  = 1;

    Fxu_HeapSingleCheck( p );
    fprintf( pFile, "The contents of the heap:\n" );
    fprintf( pFile, "Level %d:  ", Degree );
    Fxu_HeapSingleForEachItem( p, pSingle )
    {
        assert( Counter == p->pTree[Counter]->HNum );
        fprintf( pFile, "%2d=%3d  ", Counter, FXU_HEAP_SINGLE_WEIGHT(p->pTree[Counter]) );
        if ( ++Counter == (1 << Degree) )
        {
            fprintf( pFile, "\n" );
            Degree++;
            fprintf( pFile, "Level %d:  ", Degree );
        }
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "End of the heap printout.\n" );
}